

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

BlockInfo * kernel::MakeBlockInfo(CBlockIndex *index,CBlock *data)

{
  int64_t iVar1;
  CBlock *in_RDX;
  char *in_RSI;
  BlockInfo *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CBlockIndex *this;
  uint256 *hash;
  BlockInfo *pBVar2;
  char *in_stack_ffffffffffffffe8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffff0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_00;
  
  this_00 = *(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> **)(in_FS_OFFSET + 0x28);
  if (in_RSI == (char *)0x0) {
    hash = &uint256::ZERO;
  }
  else {
    hash = *(uint256 **)in_RSI;
  }
  pBVar2 = in_RDI;
  interfaces::BlockInfo::BlockInfo(in_RDI,hash);
  if (in_RSI != (char *)0x0) {
    if (*(long *)(in_RSI + 8) == 0) {
      this = (CBlockIndex *)0x0;
    }
    else {
      this = (CBlockIndex *)**(undefined8 **)(in_RSI + 8);
    }
    pBVar2->prev_hash = (uint256 *)this;
    pBVar2->height = *(int *)(in_RSI + 0x18);
    iVar1 = CBlockIndex::GetBlockTimeMax(this);
    pBVar2->chain_time_max = (uint)iVar1;
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)this);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_RSI,
               (int)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
    pBVar2->file_number = *(int *)(in_RSI + 0x1c);
    pBVar2->data_pos = *(uint *)(in_RSI + 0x20);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this);
  }
  pBVar2->data = in_RDX;
  if (*(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> **)(in_FS_OFFSET + 0x28) == this_00) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

interfaces::BlockInfo MakeBlockInfo(const CBlockIndex* index, const CBlock* data)
{
    interfaces::BlockInfo info{index ? *index->phashBlock : uint256::ZERO};
    if (index) {
        info.prev_hash = index->pprev ? index->pprev->phashBlock : nullptr;
        info.height = index->nHeight;
        info.chain_time_max = index->GetBlockTimeMax();
        LOCK(::cs_main);
        info.file_number = index->nFile;
        info.data_pos = index->nDataPos;
    }
    info.data = data;
    return info;
}